

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Tree_Item.H
# Opt level: O2

int __thiscall Fl_Tree::deselect(Fl_Tree *this,Fl_Tree_Item *item,int docallback)

{
  uint *puVar1;
  
  if (item->_selected != '\0') {
    item->_selected = '\0';
    puVar1 = &(this->super_Fl_Group).super_Fl_Widget.flags_;
    *(byte *)puVar1 = (byte)*puVar1 | 0x80;
    if (docallback != 0) {
      do_callback_for_item(this,item,FL_TREE_REASON_DESELECTED);
    }
    Fl_Widget::redraw((Fl_Widget *)this);
    return 1;
  }
  return 0;
}

Assistant:

int is_flag(unsigned short flag) const {
    switch (flag) {
      case     OPEN: return(_open ? 1 : 0);
      case  VISIBLE: return(_visible ? 1 : 0);
      case   ACTIVE: return(_active ? 1 : 0);
      case SELECTED: return(_selected ? 1 : 0);
      default:       return(0);
    }
  }